

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

void * __thiscall google::protobuf::Arena::AllocateAligned(Arena *this,size_t size,size_t align)

{
  void *pvVar1;
  size_t n;
  ArenaAlign align_as;
  ArenaAlign local_20;
  
  if (align < 9) {
    pvVar1 = Allocate(this,size + 7 & 0xfffffffffffffff8);
    return pvVar1;
  }
  local_20 = internal::ArenaAlignAs(align);
  n = internal::ArenaAlign::Padded(&local_20,size);
  pvVar1 = Allocate(this,n);
  return (void *)(-local_20.align & (long)pvVar1 + (local_20.align - 1));
}

Assistant:

void* PROTOBUF_NONNULL AllocateAligned(size_t size, size_t align = 8) {
    if (align <= internal::ArenaAlignDefault::align) {
      return Allocate(internal::ArenaAlignDefault::Ceil(size));
    } else {
      // We are wasting space by over allocating align - 8 bytes. Compared
      // to a dedicated function that takes current alignment in consideration.
      // Such a scheme would only waste (align - 8)/2 bytes on average, but
      // requires a dedicated function in the outline arena allocation
      // functions. Possibly re-evaluate tradeoffs later.
      auto align_as = internal::ArenaAlignAs(align);
      return align_as.Ceil(Allocate(align_as.Padded(size)));
    }
  }